

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O3

int coda_cursor_get_type(coda_cursor *cursor,coda_type **type)

{
  coda_type *pcVar1;
  undefined8 uVar2;
  char *message;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar1 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar1 == (coda_type *)0x0)) {
    message = "invalid cursor argument (%s:%u)";
    uVar2 = 0x7e7;
  }
  else {
    if (type != (coda_type **)0x0) {
      if (99 < pcVar1->format) {
        pcVar1 = *(coda_type **)&pcVar1->type_class;
      }
      *type = pcVar1;
      return 0;
    }
    message = "type argument is NULL (%s:%u)";
    uVar2 = 0x7ec;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                 ,uVar2);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_get_type(const coda_cursor *cursor, coda_type **type)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    return 0;
}